

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_tls.c
# Opt level: O3

mbedtls_ssl_mode_t mbedtls_ssl_get_mode_from_transform(mbedtls_ssl_transform *transform)

{
  mbedtls_cipher_info_t *pmVar1;
  mbedtls_ssl_mode_t mVar2;
  uint uVar3;
  
  pmVar1 = (transform->cipher_ctx_enc).cipher_info;
  mVar2 = MBEDTLS_SSL_MODE_STREAM;
  if ((pmVar1 != (mbedtls_cipher_info_t *)0x0) &&
     (uVar3 = (*(uint *)&pmVar1->field_0x8 >> 0xc & 0xf) - 6, uVar3 < 6)) {
    mVar2 = *(mbedtls_ssl_mode_t *)(&DAT_002518c0 + (ulong)uVar3 * 4);
  }
  return mVar2;
}

Assistant:

mbedtls_ssl_mode_t mbedtls_ssl_get_mode_from_transform(
    const mbedtls_ssl_transform *transform)
{
    mbedtls_ssl_mode_t base_mode = mbedtls_ssl_get_base_mode(
#if defined(MBEDTLS_USE_PSA_CRYPTO)
        transform->psa_alg
#else
        mbedtls_cipher_get_cipher_mode(&transform->cipher_ctx_enc)
#endif
        );

    int encrypt_then_mac = 0;
#if defined(MBEDTLS_SSL_SOME_SUITES_USE_CBC_ETM)
    encrypt_then_mac = transform->encrypt_then_mac;
#endif
    return mbedtls_ssl_get_actual_mode(base_mode, encrypt_then_mac);
}